

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O1

void check_header(gz_stream *s)

{
  uInt *puVar1;
  Bytef *pBVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar9 = (s->stream).avail_in;
  uVar10 = (ulong)uVar9;
  if (uVar10 < 2) {
    if (uVar10 != 0) {
      *s->inbuf = *(s->stream).next_in;
    }
    piVar6 = __errno_location();
    *piVar6 = 0;
    sVar7 = fread(s->inbuf + uVar10,1,0x4000L >> ((byte)uVar9 & 0x3f),(FILE *)s->file);
    if ((int)sVar7 == 0) {
      iVar3 = ferror((FILE *)s->file);
      if (iVar3 != 0) {
        s->z_err = -1;
      }
    }
    uVar9 = (int)sVar7 + (s->stream).avail_in;
    (s->stream).avail_in = uVar9;
    (s->stream).next_in = s->inbuf;
    lVar8 = 0xa8;
    if (uVar9 < 2) goto LAB_005941e2;
  }
  pBVar2 = (s->stream).next_in;
  uVar9 = 1;
  lVar8 = 0xa8;
  if ((*pBVar2 == '\x1f') && (pBVar2[1] == 0x8b)) {
    puVar1 = &(s->stream).avail_in;
    *puVar1 = *puVar1 - 2;
    (s->stream).next_in = pBVar2 + 2;
    iVar3 = get_byte(s);
    uVar4 = get_byte(s);
    uVar9 = 0xfffffffd;
    lVar8 = 0x70;
    if ((uVar4 & 0xe0) == 0 && iVar3 == 8) {
      iVar3 = 6;
      do {
        get_byte(s);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      if ((uVar4 & 4) != 0) {
        iVar3 = get_byte(s);
        iVar5 = get_byte(s);
        iVar3 = iVar3 + iVar5 * 0x100 + 1;
        do {
          iVar3 = iVar3 + -1;
          if (iVar3 == 0) break;
          iVar5 = get_byte(s);
        } while (iVar5 != -1);
      }
      if ((uVar4 & 8) != 0) {
        do {
          iVar3 = get_byte(s);
        } while (iVar3 - 1U < 0xfffffffe);
      }
      if ((uVar4 & 0x10) != 0) {
        do {
          iVar3 = get_byte(s);
        } while (iVar3 - 1U < 0xfffffffe);
      }
      if ((uVar4 & 2) != 0) {
        iVar3 = 1;
        do {
          get_byte(s);
          iVar3 = iVar3 + -1;
        } while (iVar3 == 0);
      }
      uVar9 = (uint)(s->z_eof == 0) * 3 - 3;
    }
  }
LAB_005941e2:
  *(uint *)((long)&(s->stream).next_in + lVar8) = uVar9;
  return;
}

Assistant:

local void check_header(s)
    gz_stream *s;
{
    int method; /* method byte */
    int flags;  /* flags byte */
    uInt len;
    int c;

    /* Assure two bytes in the buffer so we can peek ahead -- handle case
       where first byte of header is at the end of the buffer after the last
       gzip segment */
    len = s->stream.avail_in;
    if (len < 2) {
        if (len) s->inbuf[0] = s->stream.next_in[0];
        errno = 0;
        len = (uInt)fread(s->inbuf + len, 1, Z_BUFSIZE >> len, s->file);
        if (len == 0 && ferror(s->file)) s->z_err = Z_ERRNO;
        s->stream.avail_in += len;
        s->stream.next_in = s->inbuf;
        if (s->stream.avail_in < 2) {
            s->transparent = s->stream.avail_in;
            return;
        }
    }

    /* Peek ahead to check the gzip magic header */
    if (s->stream.next_in[0] != gz_magic[0] ||
        s->stream.next_in[1] != gz_magic[1]) {
        s->transparent = 1;
        return;
    }
    s->stream.avail_in -= 2;
    s->stream.next_in += 2;

    /* Check the rest of the gzip header */
    method = get_byte(s);
    flags = get_byte(s);
    if (method != Z_DEFLATED || (flags & RESERVED) != 0) {
        s->z_err = Z_DATA_ERROR;
        return;
    }

    /* Discard time, xflags and OS code: */
    for (len = 0; len < 6; len++) (void)get_byte(s);

    if ((flags & EXTRA_FIELD) != 0) { /* skip the extra field */
        len  =  (uInt)get_byte(s);
        len += ((uInt)get_byte(s))<<8;
        /* len is garbage if EOF but the loop below will quit anyway */
        while (len-- != 0 && get_byte(s) != EOF) ;
    }
    if ((flags & ORIG_NAME) != 0) { /* skip the original file name */
        while ((c = get_byte(s)) != 0 && c != EOF) ;
    }
    if ((flags & COMMENT) != 0) {   /* skip the .gz file comment */
        while ((c = get_byte(s)) != 0 && c != EOF) ;
    }
    if ((flags & HEAD_CRC) != 0) {  /* skip the header crc */
        for (len = 0; len < 2; len++) (void)get_byte(s);
    }
    s->z_err = s->z_eof ? Z_DATA_ERROR : Z_OK;
}